

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

Roaring64Map * __thiscall roaring::Roaring64Map::operator-=(Roaring64Map *this,Roaring64Map *other)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  _Rb_tree_color _Var4;
  _Bool _Var5;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  _Base_ptr p_Var8;
  const_iterator __position;
  iterator __result;
  bool bVar9;
  
  if (this == other) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
    ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
             *)this);
  }
  else {
    __position._M_node = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      p_Var8 = (other->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 = &(other->roarings)._M_t._M_impl.super__Rb_tree_header;
      do {
        if ((_Rb_tree_header *)p_Var8 == p_Var2) {
          return this;
        }
        _Var3 = __position._M_node[1]._M_color;
        _Var4 = p_Var8[1]._M_color;
        if (_Var3 < _Var4) {
          p_Var6 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          cVar7._M_node = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[bVar9]) {
            bVar9 = (_Rb_tree_color)*(size_t *)(p_Var6 + 1) < _Var4;
            if (!bVar9) {
              cVar7._M_node = p_Var6;
            }
          }
        }
        else if (_Var4 < _Var3) {
          p_Var6 = (other->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var8 = &p_Var2->_M_header;
          for (; cVar7._M_node = __position._M_node,
              (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[bVar9]) {
            bVar9 = (_Rb_tree_color)*(size_t *)(p_Var6 + 1) < _Var3;
            if (!bVar9) {
              p_Var8 = p_Var6;
            }
          }
        }
        else {
          roaring_bitmap_andnot_inplace
                    ((roaring_bitmap_t *)&__position._M_node[1]._M_parent,
                     (roaring_bitmap_t *)&p_Var8[1]._M_parent);
          _Var5 = roaring_bitmap_is_empty((roaring_bitmap_t *)&__position._M_node[1]._M_parent);
          cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          if (_Var5) {
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::_M_erase_aux((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                            *)this,__position);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        }
        __position._M_node = cVar7._M_node;
      } while ((_Rb_tree_header *)cVar7._M_node != p_Var1);
    }
  }
  return this;
}

Assistant:

Roaring64Map &operator-=(const Roaring64Map &other) {
        if (this == &other) {
            // Subtracting *this from itself results in the empty map.
            roarings.clear();
            return *this;
        }

        // Logic table summarizing what to do when a given outer key is
        // present vs. absent from self and other.
        //
        // self     other    (self - other)  work to do
        // --------------------------------------------
        // absent   absent   empty           None
        // absent   present  empty           None
        // present  absent   unchanged       None
        // present  present  empty or not    Subtract other from self, but
        //                                   erase self if result is empty
        //
        // Because there is only work to do when a key is present in both 'self'
        // and 'other', the main while loop ping-pongs back and forth until it
        // finds the next key that is the same on both sides.

        auto self_iter = roarings.begin();
        auto other_iter = other.roarings.cbegin();

        while (self_iter != roarings.end() &&
               other_iter != other.roarings.cend()) {
            auto self_key = self_iter->first;
            auto other_key = other_iter->first;
            if (self_key < other_key) {
                // Because self_key is < other_key, advance self_iter to the
                // first point where self_key >= other_key (or end).
                self_iter = roarings.lower_bound(other_key);
                continue;
            }

            if (self_key > other_key) {
                // Because self_key is > other_key, advance other_iter to the
                // first point where other_key >= self_key (or end).
                other_iter = other.roarings.lower_bound(self_key);
                continue;
            }

            // Both sides have self_key. In the logic table above, this reflects
            // the case (self.present & other.present). So subtract other from
            // self.
            auto &self_bitmap = self_iter->second;
            const auto &other_bitmap = other_iter->second;
            self_bitmap -= other_bitmap;

            if (self_bitmap.isEmpty()) {
                // ...but if subtraction is empty, remove it altogether.
                self_iter = roarings.erase(self_iter);
            } else {
                ++self_iter;
            }
            ++other_iter;
        }
        return *this;
    }